

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintTo(float f,ostream *os)

{
  long lVar1;
  int iVar2;
  streamsize __prec;
  streamsize old_precision;
  ostream *os_local;
  float f_local;
  
  __prec = std::ios_base::precision((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  lVar1 = *(long *)(*(long *)os + -0x18);
  iVar2 = AppropriateResolution<float>(f);
  std::ios_base::precision((ios_base *)(os + lVar1),(long)iVar2);
  std::ostream::operator<<(os,f);
  std::ios_base::precision((ios_base *)(os + *(long *)(*(long *)os + -0x18)),__prec);
  return;
}

Assistant:

inline void PrintTo(float f, ::std::ostream* os) {
  auto old_precision = os->precision();
  os->precision(AppropriateResolution(f));
  *os << f;
  os->precision(old_precision);
}